

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorPool::DescriptorPool
          (DescriptorPool *this,DescriptorDatabase *fallback_database,
          ErrorCollector *error_collector)

{
  _Rb_tree_header *p_Var1;
  Mutex *this_00;
  Tables *this_01;
  
  this_00 = (Mutex *)operator_new(8);
  internal::Mutex::Mutex(this_00);
  this->mutex_ = this_00;
  this->fallback_database_ = fallback_database;
  this->default_error_collector_ = error_collector;
  this->underlay_ = (DescriptorPool *)0x0;
  this_01 = (Tables *)operator_new(0x238);
  Tables::Tables(this_01);
  (this->tables_).ptr_ = this_01;
  this->enforce_dependencies_ = true;
  this->lazily_build_dependencies_ = false;
  this->allow_unknown_ = false;
  this->enforce_weak_ = false;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->disallow_enforce_utf8_ = false;
  return;
}

Assistant:

DescriptorPool::DescriptorPool(DescriptorDatabase* fallback_database,
                               ErrorCollector* error_collector)
  : mutex_(new Mutex),
    fallback_database_(fallback_database),
    default_error_collector_(error_collector),
    underlay_(NULL),
    tables_(new Tables),
    enforce_dependencies_(true),
    lazily_build_dependencies_(false),
    allow_unknown_(false),
    enforce_weak_(false),
    disallow_enforce_utf8_(false) {
}